

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

char * ImParseFormatFindStart(char *fmt)

{
  char cVar1;
  char *in_RCX;
  char *pcVar2;
  int iVar3;
  
  do {
    cVar1 = *fmt;
    if (cVar1 == '\0') {
      iVar3 = 3;
      pcVar2 = in_RCX;
    }
    else if ((cVar1 != '%') || (iVar3 = 1, pcVar2 = fmt, fmt[1] == '%')) {
      fmt = fmt + (ulong)(cVar1 == '%') + 1;
      iVar3 = 0;
      pcVar2 = in_RCX;
    }
    in_RCX = pcVar2;
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    fmt = pcVar2;
  }
  return fmt;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}